

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

int __thiscall rcg::System::getMajorVersion(System *this)

{
  element_type *peVar1;
  uint32_t uVar2;
  uint32_t ret;
  INFO_DATATYPE type;
  size_t size;
  
  std::recursive_mutex::lock(&this->mtx);
  ret = 0;
  size = 4;
  peVar1 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (this->tl == (TL_HANDLE)0x0) {
    (*peVar1->GCGetInfo)(9,&type,&ret,&size);
  }
  else {
    (*peVar1->TLGetInfo)(this->tl,9,&type,&ret,&size);
  }
  uVar2 = ret;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return uVar2;
}

Assistant:

int System::getMajorVersion()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  uint32_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (tl != 0)
  {
    gentl->TLGetInfo(tl, GenTL::TL_INFO_GENTL_VER_MAJOR, &type, &ret, &size);
  }
  else
  {
    gentl->GCGetInfo(GenTL::TL_INFO_GENTL_VER_MAJOR, &type, &ret, &size);
  }

  return static_cast<int>(ret);
}